

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  
  printf("%5s\t%6s\n","Fahr","Celc");
  uVar1 = 0xffffffec;
  do {
    uVar1 = uVar1 + 0x14;
    printf("%5.0f\t%6.1f\n",(double)(int)uVar1,
           (double)(float)(((double)(int)uVar1 + -32.0) * 0.5555555555555556));
  } while (uVar1 < 0x119);
  return 0;
}

Assistant:

int main()
{
    float fahr, celcius;
    int lower, upper, step;

    lower = 0;
    upper = 300;
    step = 20;

    fahr = lower;

    printf("%5s\t%6s\n", "Fahr", "Celc");
    while (fahr <= upper) {
        celcius = (5.0/9.0) * (fahr - 32.0);
        printf("%5.0f\t%6.1f\n", fahr, celcius);
        fahr = fahr + step;
    }
}